

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void qlist_bang(t_qlist *x)

{
  double dVar1;
  t_qlist *x_local;
  
  qlist_rewind(x);
  if (x->x_innext == 0) {
    qlist_donext(x,0,1);
  }
  else {
    dVar1 = clock_getsystime();
    x->x_whenclockset = dVar1;
    x->x_clockdelay = 0.0;
    clock_delay(x->x_clock,0.0);
  }
  return;
}

Assistant:

static void qlist_bang(t_qlist *x)
{
    qlist_rewind(x);
        /* if we're restarted reentrantly from a "next" message set ourselves
        up to do this non-reentrantly after a delay of 0 */
    if (x->x_innext)
    {
        x->x_whenclockset = clock_getsystime();
        x->x_clockdelay = 0;
        clock_delay(x->x_clock, 0);
    }
    else qlist_donext(x, 0, 1);
}